

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_qp.c
# Opt level: O2

char * cmime_qp_rm_charenc(char *line_in)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  __int32_t **pp_Var5;
  char cVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  sVar2 = strlen(line_in);
  pcVar3 = (char *)malloc(sVar2 + 1);
  iVar11 = 0;
  iVar9 = 0;
  do {
    if ((int)sVar2 <= iVar9) {
      pcVar3[iVar11] = '\0';
      return pcVar3;
    }
    if (line_in[iVar9] == '=') {
      if (line_in[(long)iVar9 + 1] != '?') {
        pcVar3[iVar11] = '=';
        goto LAB_0010aac1;
      }
      pcVar4 = line_in + (long)iVar9 + 2;
      iVar1 = iVar9 + 6;
      iVar10 = iVar9 + 4;
      do {
        iVar9 = iVar10;
        iVar7 = iVar1;
        iVar10 = iVar9 + 1;
        cVar6 = *pcVar4;
        pcVar4 = pcVar4 + 1;
        iVar1 = iVar7 + 1;
      } while (cVar6 != '?');
      iVar9 = iVar9 + -1;
      pp_Var5 = __ctype_tolower_loc();
      if (((*pp_Var5)[line_in[iVar9]] == 0x62) || ((*pp_Var5)[line_in[iVar9]] == 0x71)) {
        cVar6 = line_in[iVar10];
        lVar8 = 0;
        iVar9 = iVar7;
        do {
          pcVar3[lVar8 + iVar11] = cVar6;
          cVar6 = line_in[lVar8 + (long)iVar10 + 1];
          iVar9 = iVar9 + 1;
          lVar8 = lVar8 + 1;
        } while (cVar6 != '?');
        iVar11 = iVar11 + (int)lVar8;
      }
    }
    else {
      pcVar3[iVar11] = line_in[iVar9];
LAB_0010aac1:
      iVar11 = iVar11 + 1;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

char *cmime_qp_rm_charenc(char *line_in) {
    char *line_out = NULL;
    int ipos = 0;
    int opos = 0;
    int line_in_len = strlen(line_in);

    line_out = malloc(strlen(line_in)+1*sizeof(char));
    for(ipos=0; ipos<line_in_len; ipos++) {
        if(line_in[ipos] == '=') {
            int orig_ipos = ipos;

            if(line_in[ipos+1] == '?') {
                ipos++;
                
                do {
                    ipos++;
                } while (line_in[ipos] != '?');

                ipos++;

                if(tolower(line_in[ipos]) == 'q' || tolower(line_in[ipos]) == 'b') {
                    ipos+=2;
                
                    do {
                        line_out[opos] = line_in[ipos];
                        opos++;
                        ipos++; 
                    } while (line_in[ipos] != '?');

                    ipos++;
                    continue;
                }
            } else {
                ipos = orig_ipos;
                line_out[opos] = line_in[ipos];
                opos++;
            }
        } else {    
            line_out[opos] = line_in[ipos];
            opos++;
        }
    }
    line_out[opos++] = '\0';
     return line_out;
}